

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

lhpage * lhNewPage(lhash_kv_engine *pEngine,unqlite_page *pRaw,lhpage *pMaster)

{
  lhpage *pSrc;
  lhpage *plVar1;
  
  pSrc = (lhpage *)SyMemBackendPoolAlloc(&pEngine->sAllocator,0x60);
  if (pSrc != (lhpage *)0x0) {
    SyZero(pSrc,0x60);
    pSrc->pHash = pEngine;
    pSrc->pRaw = pRaw;
    plVar1 = pMaster;
    if (pMaster == (lhpage *)0x0) {
      plVar1 = pSrc;
    }
    pSrc->pMaster = plVar1;
    if (plVar1 != pSrc) {
      pSrc->pNextSlave = pMaster->pSlave;
      pMaster->pSlave = pSrc;
      pMaster->iSlave = pMaster->iSlave + 1;
    }
    pRaw->pUserData = pSrc;
  }
  return pSrc;
}

Assistant:

static lhpage * lhNewPage(
	lhash_kv_engine *pEngine, /* KV store which own this instance */
	unqlite_page *pRaw,       /* Raw page contents */
	lhpage *pMaster           /* Master page in case we are dealing with a slave page */
	)
{
	lhpage *pPage;
	/* Allocate a new instance */
	pPage = (lhpage *)SyMemBackendPoolAlloc(&pEngine->sAllocator,sizeof(lhpage));
	if( pPage == 0 ){
		return 0;
	}
	/* Zero the structure */
	SyZero(pPage,sizeof(lhpage));
	/* Fill-in the structure */
	pPage->pHash = pEngine;
	pPage->pRaw = pRaw;
	pPage->pMaster = pMaster ? pMaster /* Slave page */ : pPage /* Master page */ ;
	if( pPage->pMaster != pPage ){
		/* Slave page, attach it to its master */
		pPage->pNextSlave = pMaster->pSlave;
		pMaster->pSlave = pPage;
		pMaster->iSlave++;
	}
	/* Save this instance for future fast lookup */
	pRaw->pUserData = pPage;
	/* All done */
	return pPage;
}